

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_null(void)

{
  char cVar1;
  undefined8 uVar2;
  char *pcVar3;
  bson_t b;
  bson_error_t error;
  undefined1 auStack_380 [240];
  undefined1 local_290 [648];
  
  cVar1 = bson_init_from_json(auStack_380,"{ \"x\": null }",0xffffffffffffffff,local_290);
  if (cVar1 == '\0') {
    pcVar3 = "bson_init_from_json (&b, json, -1, &error)";
    uVar2 = 0x8de;
  }
  else {
    uVar2 = bson_bcone_magic();
    cVar1 = bcon_extract(auStack_380,"x",uVar2,9,0);
    if (cVar1 != '\0') {
      bson_destroy(auStack_380);
      return;
    }
    pcVar3 = "BCON_EXTRACT (&b, \"x\", BCONE_NULL)";
    uVar2 = 0x8df;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar2,"test_bson_json_null",pcVar3);
  abort();
}

Assistant:

static void
test_bson_json_null (void)
{
   bson_error_t error;
   bson_t b;

   const char *json = "{ \"x\": null }";
   BSON_ASSERT (bson_init_from_json (&b, json, -1, &error));
   BSON_ASSERT (BCON_EXTRACT (&b, "x", BCONE_NULL));
   bson_destroy (&b);
}